

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImagePositionCalculatorTests.cpp
# Opt level: O0

void __thiscall
ImagePositionCalculator_ImageIsExactlyHalfOfDeviceResolutionScalesAndFitsExactly_Test::
~ImagePositionCalculator_ImageIsExactlyHalfOfDeviceResolutionScalesAndFitsExactly_Test
          (ImagePositionCalculator_ImageIsExactlyHalfOfDeviceResolutionScalesAndFitsExactly_Test
           *this)

{
  ImagePositionCalculator_ImageIsExactlyHalfOfDeviceResolutionScalesAndFitsExactly_Test *this_local;
  
  testing::Test::~Test(&this->super_Test);
  return;
}

Assistant:

TEST(ImagePositionCalculator, ImageIsExactlyHalfOfDeviceResolutionScalesAndFitsExactly)
{
    ImagePositionCalculator imagePositionCalculator{};

    auto res = imagePositionCalculator.GetCenteredRectangleVertexCoordinates(1000, 1000, 500, 500);
    ASSERT_EQ(res[0], 250);
    ASSERT_EQ(res[1], 250);
    ASSERT_EQ(res[2], 0);
    ASSERT_EQ(res[3], 0);

    ASSERT_EQ(res[4], 750);
    ASSERT_EQ(res[5], 250);
    ASSERT_EQ(res[6], 1);
    ASSERT_EQ(res[7], 0);

    ASSERT_EQ(res[8], 750);
    ASSERT_EQ(res[9], 750);
    ASSERT_EQ(res[10], 1);
    ASSERT_EQ(res[11], 1);

    ASSERT_EQ(res[12], 250);
    ASSERT_EQ(res[13], 750);
    ASSERT_EQ(res[14], 0);
    ASSERT_EQ(res[15], 1);
}